

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<std::complex<long_double>_>::SolveSOR
          (TPZMatrix<std::complex<long_double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<long_double>_> *F,TPZFMatrix<std::complex<long_double>_> *result,
          TPZFMatrix<std::complex<long_double>_> *residual,
          TPZFMatrix<std::complex<long_double>_> *param_5,REAL overrelax,REAL *tol,int FromCurrent,
          int direction)

{
  long lVar1;
  complex<long_double> *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble lVar11;
  longdouble lVar12;
  longdouble in_ST2;
  longdouble lVar13;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar14;
  complex<long_double> __r;
  complex<long_double> eqres;
  longdouble local_154;
  complex<long_double> local_148;
  undefined1 local_128 [16];
  longdouble local_118;
  long *local_108;
  TPZFMatrix<std::complex<long_double>_> *local_100;
  complex<long_double> local_f8;
  double *local_d8;
  int64_t local_d0;
  long local_c8;
  long local_c0;
  TPZFMatrix<std::complex<long_double>_> *local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  double local_90;
  double local_88;
  longdouble local_64;
  undefined1 local_58 [40];
  
  local_108 = numiterations;
  local_100 = F;
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  local_118 = (longdouble)CONCAT28(local_118._8_2_,overrelax);
  local_d8 = tol;
  local_f8._M_value._0_8_ = SUB108((longdouble)*tol,0);
  local_f8._M_value._8_2_ = SUB102((unkuint10)(longdouble)*tol >> 0x40,0);
  lVar11 = (longdouble)0;
  local_f8._M_value._16_8_ = SUB108(lVar11,0);
  local_f8._M_value._24_2_ = SUB102((unkuint10)lVar11 >> 0x40,0);
  lVar9 = (longdouble)2.0;
  local_148._M_value._0_4_ = SUB104(lVar9,0);
  local_148._M_value._4_4_ = SUB104((unkuint10)lVar9 >> 0x20,0);
  local_148._M_value._8_2_ = SUB102((unkuint10)lVar9 >> 0x40,0);
  local_148._M_value._16_4_ = SUB104(lVar11,0);
  local_148._M_value._20_4_ = SUB104((unkuint10)lVar11 >> 0x20,0);
  local_148._M_value._24_2_ = local_f8._M_value._24_2_;
  std::complex<long_double>::operator*=(&local_148,&local_f8);
  lVar11 = (longdouble)0 +
           (longdouble)
           CONCAT28(local_148._M_value._24_2_,
                    CONCAT44(local_148._M_value._20_4_,local_148._M_value._16_4_));
  local_128._0_10_ =
       (longdouble)1 +
       (longdouble)
       CONCAT28(local_148._M_value._8_2_,CONCAT44(local_148._M_value._4_4_,local_148._M_value._0_4_)
               );
  lVar9 = in_ST4;
  if (residual != (TPZFMatrix<std::complex<long_double>_> *)0x0) {
    Dot<std::complex<long_double>>(&local_148,residual,residual);
    sqrtl();
    lVar11 = (longdouble)0;
    local_128._0_10_ = in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
  }
  local_b8 = residual;
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  local_c0 = CONCAT44(extraout_var,iVar3);
  local_d0 = (local_100->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  lVar6 = 0;
  bVar8 = direction != -1;
  local_a8 = local_c0 + -1;
  if (bVar8) {
    local_a8 = lVar6;
  }
  local_c8 = -1;
  if (bVar8) {
    local_c8 = local_c0;
  }
  local_f8._M_value._0_8_ = SUB108((longdouble)0,0);
  local_f8._M_value._8_2_ = SUB102((unkuint10)(longdouble)0 >> 0x40,0);
  lVar10 = (longdouble)local_128._0_10_;
  local_f8._M_value._16_8_ = local_f8._M_value._0_8_;
  local_f8._M_value._24_2_ = local_f8._M_value._8_2_;
  if (0 < *local_108) {
    local_a0 = (ulong)bVar8 * 2 + -1;
    local_88 = local_118._0_8_;
    lVar6 = 0;
    local_64 = (longdouble)local_118._0_8_;
    do {
      local_148._M_value._0_4_ = SUB104(lVar10,0);
      local_148._M_value._4_4_ = SUB104((unkuint10)lVar10 >> 0x20,0);
      local_148._M_value._8_2_ = SUB102((unkuint10)lVar10 >> 0x40,0);
      local_148._M_value._16_4_ = SUB104(lVar11,0);
      local_148._M_value._20_4_ = SUB104((unkuint10)lVar11 >> 0x20,0);
      local_148._M_value._24_2_ = SUB102((unkuint10)lVar11 >> 0x40,0);
      lVar12 = lVar9;
      lVar13 = lVar9;
      local_128._0_10_ = lVar10;
      cabsl();
      local_90 = (double)in_ST0;
      lVar10 = (longdouble)local_128._0_10_;
      in_ST0 = in_ST1;
      if (ABS(local_90) <= ABS(*local_d8)) break;
      local_154 = (longdouble)0;
      lVar11 = in_ST2;
      lVar14 = lVar13;
      local_118 = local_154;
      local_b0 = lVar6;
      if (0 < local_d0) {
        local_128._0_10_ = (unkuint10)(ushort)local_128._8_2_ << 0x40;
        lVar6 = 0;
        local_154 = (longdouble)0;
        local_118 = local_154;
        do {
          lVar4 = local_a8;
          if (local_a8 != local_c8) {
            do {
              (*(local_100->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable[0x24])(&local_148,local_100,lVar4,lVar6);
              local_f8._M_value._4_4_ = local_148._M_value._4_4_;
              local_f8._M_value._0_4_ = local_148._M_value._0_4_;
              local_f8._M_value._20_4_ = local_148._M_value._20_4_;
              local_f8._M_value._16_4_ = local_148._M_value._16_4_;
              local_f8._M_value._24_2_ = local_148._M_value._24_2_;
              local_f8._M_value._26_6_ =
                   SUB86(CONCAT44(local_148._M_value._28_4_,
                                  CONCAT22(local_148._M_value._26_2_,local_148._M_value._24_2_)) >>
                         0x10,0);
              local_f8._M_value._8_2_ = local_148._M_value._8_2_;
              local_f8._M_value._10_6_ =
                   SUB86(CONCAT44(local_148._M_value._12_4_,
                                  CONCAT22(local_148._M_value._10_2_,local_148._M_value._8_2_)) >>
                         0x10,0);
              lVar10 = in_ST1;
              lVar12 = lVar11;
              if (0 < local_c0) {
                lVar7 = 0;
                lVar5 = 0;
                do {
                  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (local_58,this,lVar4,lVar5);
                  lVar1 = (result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                          fRow;
                  if ((lVar1 <= lVar5) ||
                     ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                      <= lVar6)) {
                    TPZFMatrix<std::complex<long_double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  local_148._M_value._16_4_ = SUB84(local_58._16_8_,0);
                  local_148._M_value._20_4_ = SUB84(local_58._16_8_,4);
                  local_148._M_value._24_2_ = local_58._24_2_;
                  local_148._M_value._26_2_ = SUB62(local_58._26_6_,0);
                  local_148._M_value._28_4_ = SUB64(local_58._26_6_,2);
                  local_148._M_value._0_4_ = SUB84(local_58._0_8_,0);
                  local_148._M_value._4_4_ = SUB84(local_58._0_8_,4);
                  local_148._M_value._8_2_ = local_58._8_2_;
                  local_148._M_value._10_2_ = SUB62(local_58._10_6_,0);
                  local_148._M_value._12_4_ = SUB64(local_58._10_6_,2);
                  std::complex<long_double>::operator*=
                            (&local_148,
                             (complex<long_double> *)
                             (result->fElem->_M_value + lVar7 + lVar1 * local_128._0_8_));
                  lVar13 = (longdouble)CONCAT28(local_f8._M_value._8_2_,local_f8._M_value._0_8_) -
                           (longdouble)
                           CONCAT28(local_148._M_value._8_2_,
                                    CONCAT44(local_148._M_value._4_4_,local_148._M_value._0_4_));
                  lVar11 = (longdouble)CONCAT28(local_f8._M_value._24_2_,local_f8._M_value._16_8_) -
                           (longdouble)
                           CONCAT28(local_148._M_value._24_2_,
                                    CONCAT44(local_148._M_value._20_4_,local_148._M_value._16_4_));
                  local_f8._M_value._0_8_ = SUB108(lVar13,0);
                  local_f8._M_value._8_2_ = SUB102((unkuint10)lVar13 >> 0x40,0);
                  local_f8._M_value._16_8_ = SUB108(lVar11,0);
                  local_f8._M_value._24_2_ = SUB102((unkuint10)lVar11 >> 0x40,0);
                  lVar5 = lVar5 + 1;
                  lVar7 = lVar7 + 0x20;
                } while (local_c0 != lVar5);
              }
              lVar11 = lVar9;
              in_ST1 = in_ST3;
              local_148._M_value._16_4_ = local_f8._M_value._16_4_;
              local_148._M_value._20_4_ = local_f8._M_value._20_4_;
              local_148._M_value._24_2_ = local_f8._M_value._24_2_;
              local_148._M_value._26_2_ = local_f8._M_value._26_2_;
              local_148._M_value._28_4_ = local_f8._M_value._28_4_;
              local_148._M_value._0_4_ = local_f8._M_value._0_4_;
              local_148._M_value._4_4_ = local_f8._M_value._4_4_;
              local_148._M_value._8_2_ = local_f8._M_value._8_2_;
              local_148._M_value._10_2_ = local_f8._M_value._10_2_;
              local_148._M_value._12_4_ = local_f8._M_value._12_4_;
              std::complex<long_double>::operator*=(&local_148,&local_f8);
              local_118 = local_118 +
                          (longdouble)
                          CONCAT28(local_148._M_value._8_2_,
                                   CONCAT44(local_148._M_value._4_4_,local_148._M_value._0_4_));
              local_154 = local_154 +
                          (longdouble)
                          CONCAT28(local_148._M_value._24_2_,
                                   CONCAT44(local_148._M_value._20_4_,local_148._M_value._16_4_));
              local_148._M_value._0_4_ = SUB104(local_64,0);
              local_148._M_value._4_4_ = SUB104((unkuint10)local_64 >> 0x20,0);
              local_148._M_value._8_2_ = SUB102((unkuint10)local_64 >> 0x40,0);
              lVar9 = (longdouble)0;
              local_148._M_value._16_4_ = SUB104(lVar9,0);
              local_148._M_value._20_4_ = SUB104((unkuint10)lVar9 >> 0x20,0);
              local_148._M_value._24_2_ = SUB102((unkuint10)lVar9 >> 0x40,0);
              std::complex<long_double>::operator*=(&local_148,&local_f8);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (local_58,this,lVar4,lVar4);
              in_ST3 = lVar11;
              lVar9 = lVar11;
              __divxc3();
              if (((lVar4 < 0) ||
                  (lVar5 = (result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix
                           .fRow, lVar5 <= lVar4)) ||
                 ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <=
                  lVar6)) {
                TPZFMatrix<std::complex<long_double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar5 = lVar5 * lVar6;
              pcVar2 = result->fElem;
              lVar13 = *(longdouble *)(pcVar2[lVar5 + lVar4]._M_value + 0x10);
              *(longdouble *)pcVar2[lVar5 + lVar4]._M_value =
                   lVar10 + *(longdouble *)pcVar2[lVar5 + lVar4]._M_value;
              *(longdouble *)(pcVar2[lVar5 + lVar4]._M_value + 0x10) = lVar12 + lVar13;
              lVar4 = lVar4 + local_a0;
              lVar12 = lVar9;
              lVar13 = lVar9;
              lVar14 = lVar9;
            } while (lVar4 != local_c8);
          }
          lVar6 = lVar6 + 1;
          local_128._0_8_ = local_128._0_8_ + 0x20;
        } while (lVar6 != local_d0);
      }
      local_148._M_value._0_4_ = SUB104(local_118,0);
      local_148._M_value._4_4_ = SUB104((unkuint10)local_118 >> 0x20,0);
      local_148._M_value._8_2_ = SUB102((unkuint10)local_118 >> 0x40,0);
      local_148._M_value._16_4_ = SUB104(local_154,0);
      local_148._M_value._20_4_ = SUB104((unkuint10)local_154 >> 0x20,0);
      local_148._M_value._24_2_ = SUB102((unkuint10)local_154 >> 0x40,0);
      csqrtl();
      lVar6 = local_b0 + 1;
      lVar10 = in_ST1;
      in_ST0 = in_ST3;
      in_ST1 = lVar9;
      in_ST2 = lVar12;
      in_ST3 = lVar13;
      lVar9 = lVar14;
    } while (lVar6 < *local_108);
  }
  if (local_b8 != (TPZFMatrix<std::complex<long_double>_> *)0x0) {
    local_128._0_10_ = lVar10;
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,local_100);
    lVar10 = (longdouble)local_128._0_10_;
  }
  *local_108 = lVar6;
  local_148._M_value._0_4_ = SUB104(lVar10,0);
  local_148._M_value._4_4_ = SUB104((unkuint10)lVar10 >> 0x20,0);
  local_148._M_value._8_2_ = SUB102((unkuint10)lVar10 >> 0x40,0);
  local_148._M_value._16_4_ = SUB104(lVar11,0);
  local_148._M_value._20_4_ = SUB104((unkuint10)lVar11 >> 0x20,0);
  local_148._M_value._24_2_ = SUB102((unkuint10)lVar11 >> 0x40,0);
  cabsl();
  *local_d8 = ABS((double)in_ST0);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}